

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

TypeDenoter * __thiscall Parser::parseTypeDenoter(Parser *this)

{
  pointer pcVar1;
  FILE *__stream;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  string *psVar9;
  TypeDenoter *this_00;
  undefined8 extraout_RAX;
  pointer pTVar11;
  ulong uVar12;
  string type;
  undefined1 local_70 [32];
  string local_50;
  ulong uVar10;
  
  psVar9 = Token::getValue_abi_cxx11_(this->currentToken);
  local_70._0_8_ = local_70 + 0x10;
  pcVar1 = (psVar9->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_70,pcVar1,pcVar1 + psVar9->_M_string_length);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
                     "int");
  iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
                     "double");
  iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
                     "float");
  iVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
                     "long");
  iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
                     "String");
  iVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
                     "char");
  if ((((iVar7 != 0) && (iVar6 != 0)) && (iVar5 != 0)) &&
     (((iVar4 != 0 && (iVar2 != 0)) && (iVar3 != 0)))) {
    parseTypeDenoter((Parser *)local_70);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        local_50._M_dataplus._M_p !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    operator_delete(this,0x28);
    if ((undefined1 *)local_70._0_8_ != local_70 + 0x10) {
      operator_delete((void *)local_70._0_8_,local_70._16_8_ + 1);
    }
    _Unwind_Resume(extraout_RAX);
  }
  uVar8 = this->curTokenPos + 1;
  uVar10 = (ulong)uVar8;
  this->curTokenPos = uVar8;
  pTVar11 = (this->tokenList).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
            super__Vector_impl_data._M_start;
  uVar12 = ((long)(this->tokenList).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)pTVar11 >> 4) * -0x5555555555555555;
  pTVar11 = pTVar11 + uVar10;
  if (uVar12 < uVar10 || uVar12 - uVar10 == 0) {
    pTVar11 = (pointer)0x0;
  }
  this->currentToken = pTVar11;
  __stream = _stdout;
  Token::tokenDesc_abi_cxx11_(&local_50,(Token *)0x0,(TokenType)pTVar11);
  fprintf(__stream,"\x1b[32m\tParsing [Type (%s) ] \'%s\'\n\x1b[0m",local_50._M_dataplus._M_p,
          local_70._0_8_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  this_00 = (TypeDenoter *)operator_new(0x28);
  Scanner::toUpper(&local_50,(string *)local_70);
  TypeDenoter::TypeDenoter(this_00,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_70._0_8_ != local_70 + 0x10) {
    operator_delete((void *)local_70._0_8_,local_70._16_8_ + 1);
  }
  return this_00;
}

Assistant:

TypeDenoter *Parser::parseTypeDenoter() {
    std::string type = currentToken->getValue();

    bool verified = false;

#ifdef _INT
    if (type == "int") {
        verified = true;
    }
#endif
#ifdef _DOUBLE
    if (type == "double") {
        verified = true;
    }
#endif
#ifdef _FLOAT
    if (type == "float") {
        verified = true;
    }
#endif
#ifdef _LONG
    if (type == "long") {
        verified = true;
    }
#endif
#ifdef _STRING
    if (type == "String") {
        verified = true;
    }
#endif
#ifdef _CHAR
    if (type == "char") {
        verified = true;
    }
#endif

    if (verified) {
        // Prep next token
        loadNextToken();

        // Debug output
        if (_VERBOSITY >= 3) {
            fprintf(stdout, ANSI_COLOR_GREEN "\tParsing [Type (%s) ] \'%s\'\n" ANSI_COLOR_RESET,
                    Token::tokenDesc(TokenType::IdentifierToken).data(), type.data());
        }

        return new TypeDenoter(Scanner::toUpper(type));
    }

    fprintf(stderr, "\nFATAL: Unknown data type \'%s\' is not defined!", type.data());
    exit(1);
}